

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O0

char * stbi_zlib_decode_malloc_guesssize(char *buffer,int len,int initial_size,int *outlen)

{
  int iVar1;
  char *obuf;
  char *p;
  zbuf a;
  int *outlen_local;
  int initial_size_local;
  int len_local;
  char *buffer_local;
  
  a._4088_8_ = outlen;
  obuf = (char *)malloc((long)initial_size);
  if (obuf == (char *)0x0) {
    buffer_local = (char *)0x0;
  }
  else {
    a.zbuffer = (uint8 *)(buffer + len);
    p = buffer;
    iVar1 = do_zlib((zbuf *)&p,obuf,initial_size,1,1);
    if (iVar1 == 0) {
      free(a.zout);
      buffer_local = (char *)0x0;
    }
    else {
      if (a._4088_8_ != 0) {
        *(int *)a._4088_8_ = a.num_bits - (int)a.zout;
      }
      buffer_local = a.zout;
    }
  }
  return buffer_local;
}

Assistant:

char *stbi_zlib_decode_malloc_guesssize(const char *buffer, int len, int initial_size, int *outlen)
{
   zbuf a;
   char *p = (char *) malloc(initial_size);
   if (p == NULL) return NULL;
   a.zbuffer = (uint8 *) buffer;
   a.zbuffer_end = (uint8 *) buffer + len;
   if (do_zlib(&a, p, initial_size, 1, 1)) {
      if (outlen) *outlen = (int) (a.zout - a.zout_start);
      return a.zout_start;
   } else {
      free(a.zout_start);
      return NULL;
   }
}